

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O0

int jpc_mqenc_putbit(jpc_mqenc_t *mqenc,int bit)

{
  jpc_mqstate_t *pjVar1;
  int_fast16_t iVar2;
  uchar *puVar3;
  int iVar4;
  uint_fast32_t uVar5;
  long lVar6;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  jpc_mqstate_t *state_1;
  jpc_mqstate_t *state;
  int bit_local;
  jpc_mqenc_t *mqenc_local;
  
  iVar4 = jas_getdbglevel();
  if (99 < iVar4) {
    jas_eprintf("jpc_mqenc_putbit(%p, %d)\n",mqenc,(ulong)(uint)bit);
  }
  pjVar1 = *mqenc->curctx;
  if ((uint)(pjVar1->mps & 1) == bit) {
    mqenc->areg = mqenc->areg - pjVar1->qeval;
    if ((mqenc->areg & 0x8000) == 0) {
      jpc_mqenc_codemps2(mqenc);
    }
    else {
      mqenc->creg = pjVar1->qeval + mqenc->creg;
    }
  }
  else {
    pjVar1 = *mqenc->curctx;
    mqenc->areg = mqenc->areg - pjVar1->qeval;
    if (mqenc->areg < pjVar1->qeval) {
      mqenc->creg = pjVar1->qeval + mqenc->creg;
    }
    else {
      mqenc->areg = pjVar1->qeval;
    }
    *mqenc->curctx = pjVar1->nlps;
    do {
      mqenc->areg = mqenc->areg << 1;
      mqenc->creg = mqenc->creg << 1;
      uVar5 = mqenc->ctreg - 1;
      mqenc->ctreg = uVar5;
      if (uVar5 == 0) {
        if (mqenc->outbuf == 0xff) {
          if (-1 < mqenc->outbuf) {
            if ((mqenc->out->flags_ & 7U) == 0) {
              if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
                mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
                iVar4 = mqenc->out->cnt_ + -1;
                mqenc->out->cnt_ = iVar4;
                if (iVar4 < 0) {
                  local_54 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
                }
                else {
                  mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                  iVar2 = mqenc->outbuf;
                  puVar3 = mqenc->out->ptr_;
                  mqenc->out->ptr_ = puVar3 + 1;
                  *puVar3 = (uchar)iVar2;
                  local_54 = (uint)iVar2 & 0xff;
                }
                local_50 = local_54;
              }
              else {
                mqenc->out->flags_ = mqenc->out->flags_ | 4;
                local_50 = 0xffffffff;
              }
              local_58 = local_50;
            }
            else {
              local_58 = 0xffffffff;
            }
            if (local_58 == 0xffffffff) {
              mqenc->err = mqenc->err | 1;
            }
          }
          mqenc->lastbyte = mqenc->outbuf;
          mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
          mqenc->creg = mqenc->creg & 0xfffff;
          mqenc->ctreg = 7;
        }
        else if ((mqenc->creg & 0x8000000) == 0) {
          if (-1 < mqenc->outbuf) {
            if ((mqenc->out->flags_ & 7U) == 0) {
              if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
                mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
                iVar4 = mqenc->out->cnt_ + -1;
                mqenc->out->cnt_ = iVar4;
                if (iVar4 < 0) {
                  local_48 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
                }
                else {
                  mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                  iVar2 = mqenc->outbuf;
                  puVar3 = mqenc->out->ptr_;
                  mqenc->out->ptr_ = puVar3 + 1;
                  *puVar3 = (uchar)iVar2;
                  local_48 = (uint)iVar2 & 0xff;
                }
                local_44 = local_48;
              }
              else {
                mqenc->out->flags_ = mqenc->out->flags_ | 4;
                local_44 = 0xffffffff;
              }
              local_4c = local_44;
            }
            else {
              local_4c = 0xffffffff;
            }
            if (local_4c == 0xffffffff) {
              mqenc->err = mqenc->err | 1;
            }
          }
          mqenc->lastbyte = mqenc->outbuf;
          mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
          mqenc->creg = mqenc->creg & 0x7ffff;
          mqenc->ctreg = 8;
        }
        else {
          lVar6 = mqenc->outbuf + 1;
          mqenc->outbuf = lVar6;
          if (lVar6 == 0xff) {
            mqenc->creg = mqenc->creg & 0x7ffffff;
            if (-1 < mqenc->outbuf) {
              if ((mqenc->out->flags_ & 7U) == 0) {
                if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
                  mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
                  iVar4 = mqenc->out->cnt_ + -1;
                  mqenc->out->cnt_ = iVar4;
                  if (iVar4 < 0) {
                    local_30 = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
                  }
                  else {
                    mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                    iVar2 = mqenc->outbuf;
                    puVar3 = mqenc->out->ptr_;
                    mqenc->out->ptr_ = puVar3 + 1;
                    *puVar3 = (uchar)iVar2;
                    local_30 = (uint)iVar2 & 0xff;
                  }
                  local_2c = local_30;
                }
                else {
                  mqenc->out->flags_ = mqenc->out->flags_ | 4;
                  local_2c = 0xffffffff;
                }
                local_34 = local_2c;
              }
              else {
                local_34 = 0xffffffff;
              }
              if (local_34 == 0xffffffff) {
                mqenc->err = mqenc->err | 1;
              }
            }
            mqenc->lastbyte = mqenc->outbuf;
            mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
            mqenc->creg = mqenc->creg & 0xfffff;
            mqenc->ctreg = 7;
          }
          else {
            if (-1 < mqenc->outbuf) {
              if ((mqenc->out->flags_ & 7U) == 0) {
                if ((mqenc->out->rwlimit_ < 0) || (mqenc->out->rwcnt_ < mqenc->out->rwlimit_)) {
                  mqenc->out->bufmode_ = mqenc->out->bufmode_ | 0x20;
                  iVar4 = mqenc->out->cnt_ + -1;
                  mqenc->out->cnt_ = iVar4;
                  if (iVar4 < 0) {
                    local_3c = jas_stream_flushbuf(mqenc->out,(uint)mqenc->outbuf & 0xff);
                  }
                  else {
                    mqenc->out->rwcnt_ = mqenc->out->rwcnt_ + 1;
                    iVar2 = mqenc->outbuf;
                    puVar3 = mqenc->out->ptr_;
                    mqenc->out->ptr_ = puVar3 + 1;
                    *puVar3 = (uchar)iVar2;
                    local_3c = (uint)iVar2 & 0xff;
                  }
                  local_38 = local_3c;
                }
                else {
                  mqenc->out->flags_ = mqenc->out->flags_ | 4;
                  local_38 = 0xffffffff;
                }
                local_40 = local_38;
              }
              else {
                local_40 = 0xffffffff;
              }
              if (local_40 == 0xffffffff) {
                mqenc->err = mqenc->err | 1;
              }
            }
            mqenc->lastbyte = mqenc->outbuf;
            mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
            mqenc->creg = mqenc->creg & 0x7ffff;
            mqenc->ctreg = 8;
          }
        }
      }
    } while ((mqenc->areg & 0x8000) == 0);
  }
  iVar4 = 0;
  if (mqenc->err != 0) {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int jpc_mqenc_putbit(jpc_mqenc_t *mqenc, int bit)
{
	const jpc_mqstate_t *state;
	JAS_DBGLOG(100, ("jpc_mqenc_putbit(%p, %d)\n", mqenc, bit));
	JPC_MQENC_CALL(100, jpc_mqenc_dump(mqenc, stderr));

	state = *(mqenc->curctx);

	if (state->mps == bit) {
		/* Apply the CODEMPS algorithm as defined in the standard. */
		mqenc->areg -= state->qeval;
		if (!(mqenc->areg & 0x8000)) {
			jpc_mqenc_codemps2(mqenc);
		} else {
			mqenc->creg += state->qeval;
		}
	} else {
		/* Apply the CODELPS algorithm as defined in the standard. */
		jpc_mqenc_codelps2(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc->curctx, mqenc);
	}

	return jpc_mqenc_error(mqenc) ? (-1) : 0;
}